

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

string * __thiscall picojson::value::to_str_abi_cxx11_(string *__return_storage_ptr__,value *this)

{
  int iVar1;
  lconv *plVar2;
  size_t __n;
  runtime_error *this_00;
  char *pcVar3;
  char *__s;
  double dVar4;
  double __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  double local_148;
  undefined8 uStack_140;
  double tmp;
  char buf [256];
  
  switch(this->type_) {
  case 0:
    pcVar3 = "null";
    break;
  case 1:
    pcVar3 = "false";
    if ((this->u_).boolean_ != false) {
      pcVar3 = "true";
    }
    break;
  case 2:
    __x = (this->u_).number_;
    if (9007199254740992.0 <= ABS(__x)) {
      pcVar3 = "%.17g";
    }
    else {
      uStack_140 = 0;
      local_148 = __x;
      dVar4 = modf(__x,&tmp);
      pcVar3 = "%.f";
      if (dVar4 != 0.0) {
        pcVar3 = "%.17g";
      }
      __x = local_148;
      if (NAN(dVar4)) {
        pcVar3 = "%.17g";
      }
    }
    __s = buf;
    snprintf(__s,0x100,pcVar3,__x);
    plVar2 = localeconv();
    pcVar3 = plVar2->decimal_point;
    if ((*pcVar3 != '.') || (pcVar3[1] != '\0')) {
      __n = strlen(pcVar3);
      for (; *__s != '\0'; __s = __s + 1) {
        iVar1 = strncmp(__s,pcVar3,__n);
        if (iVar1 == 0) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_188,buf,__s);
          std::operator+(&local_168,&local_188,".");
          std::operator+(__return_storage_ptr__,&local_168,__s + __n);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          return __return_storage_ptr__;
        }
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,buf,(allocator *)&local_168);
    return __return_storage_ptr__;
  case 3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->u_).string_);
    return __return_storage_ptr__;
  case 4:
    pcVar3 = "array";
    break;
  case 5:
    pcVar3 = "object";
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"0");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)buf);
  return __return_storage_ptr__;
}

Assistant:

inline std::string value::to_str() const {
    switch (type_) {
    case null_type:      return "null";
    case boolean_type:   return u_.boolean_ ? "true" : "false";
#ifdef PICOJSON_USE_INT64
    case int64_type: {
      char buf[sizeof("-9223372036854775808")];
      SNPRINTF(buf, sizeof(buf), "%" PRId64, u_.int64_);
      return buf;
    }
#endif
    case number_type:    {
      char buf[256];
      double tmp;
      SNPRINTF(buf, sizeof(buf), fabs(u_.number_) < (1ULL << 53) && modf(u_.number_, &tmp) == 0 ? "%.f" : "%.17g", u_.number_);
#if PICOJSON_USE_LOCALE
      char *decimal_point = localeconv()->decimal_point;
      if (strcmp(decimal_point, ".") != 0) {
        size_t decimal_point_len = strlen(decimal_point);
        for (char *p = buf; *p != '\0'; ++p) {
          if (strncmp(p, decimal_point, decimal_point_len) == 0) {
            return std::string(buf, p) + "." + (p + decimal_point_len);
          }
        }
      }
#endif
      return buf;
    }
    case string_type:    return *u_.string_;
    case array_type:     return "array";
    case object_type:    return "object";
    default:             PICOJSON_ASSERT(0);
#ifdef _MSC_VER
      __assume(0);
#endif
    }
    return std::string();
  }